

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O3

long jas_stream_length(jas_stream_t *stream)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = jas_stream_tell(stream);
  lVar3 = -1;
  if (-1 < lVar1) {
    lVar2 = jas_stream_seek(stream,0,2);
    if (-1 < lVar2) {
      lVar2 = jas_stream_tell(stream);
      if (-1 < lVar2) {
        lVar1 = jas_stream_seek(stream,lVar1,0);
        lVar3 = -1;
        if (-1 < lVar1) {
          lVar3 = lVar2;
        }
      }
    }
  }
  return lVar3;
}

Assistant:

long jas_stream_length(jas_stream_t *stream)
{
	long oldpos;
	long pos;
	if ((oldpos = jas_stream_tell(stream)) < 0) {
		return -1;
	}
	if (jas_stream_seek(stream, 0, SEEK_END) < 0) {
		return -1;
	}
	if ((pos = jas_stream_tell(stream)) < 0) {
		return -1;
	}
	if (jas_stream_seek(stream, oldpos, SEEK_SET) < 0) {
		return -1;
	}
	return pos;
}